

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::find_eoi(jpeg_decoder *this)

{
  if (this->m_progressive_flag == 0) {
    this->m_bits_left = 0x10;
    get_bits(this,0x10);
    get_bits(this,0x10);
    process_markers(this);
  }
  this->m_total_bytes_read = this->m_total_bytes_read - this->m_in_buf_left;
  return;
}

Assistant:

void jpeg_decoder::find_eoi()
	{
		if (!m_progressive_flag)
		{
			// Attempt to read the EOI marker.
			//get_bits_no_markers(m_bits_left & 7);

			// Prime the bit buffer
			m_bits_left = 16;
			get_bits(16);
			get_bits(16);

			// The next marker _should_ be EOI
			process_markers();
		}

		m_total_bytes_read -= m_in_buf_left;
	}